

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O2

void __thiscall
LUPMatrix::LUPMatrix
          (LUPMatrix *this,Matrix *l,Matrix *u,Permutation *row_permutation,
          Permutation *column_permutation)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  
  Matrix::Matrix(&this->l_,l);
  Matrix::Matrix(&this->u_,u);
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->row_permutation_).permutation_,&row_permutation->permutation_);
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->column_permutation_).permutation_,&column_permutation->permutation_);
  bVar1 = Matrix::IsLowerTriangular(&this->l_);
  if (bVar1) {
    bVar1 = Matrix::IsUpperTriangular(&this->u_);
    if (bVar1) {
      return;
    }
    __assertion = "u_.IsUpperTriangular()";
    __line = 0xb;
  }
  else {
    __assertion = "l_.IsLowerTriangular()";
    __line = 10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/lup_matrix.cpp"
                ,__line,
                "LUPMatrix::LUPMatrix(Matrix, Matrix, const Permutation &, const Permutation &)");
}

Assistant:

LUPMatrix::LUPMatrix(Matrix l, Matrix u,
                     const Permutation& row_permutation,
                     const Permutation& column_permutation)
    : l_(std::move(l)),
      u_(std::move(u)),
      row_permutation_(row_permutation),
      column_permutation_(column_permutation) {
  assert(l_.IsLowerTriangular());
  assert(u_.IsUpperTriangular());
}